

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

Dim * __thiscall
cnn::KMaxPooling::dim_forward
          (Dim *__return_storage_ptr__,KMaxPooling *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_20;
  uint local_1c;
  
  local_1c = this->k;
  if (local_1c == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Bad bad k in KMaxPooling: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad k in KMaxPooling");
  }
  else {
    pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pDVar1->nd == 2) && (local_1c <= pDVar1->d[1])) {
      local_20 = pDVar1->d[0];
      x._M_len = 2;
      x._M_array = &local_20;
      Dim::Dim(__return_storage_ptr__,x);
      return __return_storage_ptr__;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Bad input dimensions in KMaxPooling: ");
    poVar2 = operator<<(poVar2,xs);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in KMaxPooling");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim KMaxPooling::dim_forward(const vector<Dim>& xs) const {
  if (k < 1) {
    cerr << "Bad bad k in KMaxPooling: " << k << endl;
    throw std::invalid_argument("bad k in KMaxPooling");
  }
  if (xs[0].ndims() != 2 || (xs[0].cols() < k)) {
    cerr << "Bad input dimensions in KMaxPooling: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in KMaxPooling");
  }
  return Dim({xs[0].rows(), k});
}